

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_nal.c
# Opt level: O0

int nal_to_rbsp(uint8_t *nal_buf,int *nal_size,uint8_t *rbsp_buf,int *rbsp_size)

{
  int local_3c;
  int local_38;
  int count;
  int j;
  int i;
  int *rbsp_size_local;
  uint8_t *rbsp_buf_local;
  int *nal_size_local;
  uint8_t *nal_buf_local;
  
  local_38 = 0;
  local_3c = 0;
  for (count = 0; count < *nal_size; count = count + 1) {
    if ((local_3c == 2) && (nal_buf[count] < 3)) {
      return -1;
    }
    if ((local_3c == 2) && (nal_buf[count] == '\x03')) {
      if ((count < *nal_size + -1) && (3 < nal_buf[count + 1])) {
        return -1;
      }
      if (count == *nal_size + -1) break;
      count = count + 1;
      local_3c = 0;
    }
    if (*rbsp_size <= local_38) {
      return -1;
    }
    rbsp_buf[local_38] = nal_buf[count];
    if (nal_buf[count] == '\0') {
      local_3c = local_3c + 1;
    }
    else {
      local_3c = 0;
    }
    local_38 = local_38 + 1;
  }
  *nal_size = count;
  *rbsp_size = local_38;
  return local_38;
}

Assistant:

int nal_to_rbsp(const uint8_t* nal_buf, int* nal_size, uint8_t* rbsp_buf, int* rbsp_size)
{
    int i;
    int j     = 0;
    int count = 0;
  
    for( i = 0; i < *nal_size; i++ )
    { 
        // in NAL unit, 0x000000, 0x000001 or 0x000002 shall not occur at any byte-aligned position
        if( ( count == 2 ) && ( nal_buf[i] < 0x03) ) 
        {
            return -1;
        }

        if( ( count == 2 ) && ( nal_buf[i] == 0x03) )
        {
            // check the 4th byte after 0x000003, except when cabac_zero_word is used, in which case the last three bytes of this NAL unit must be 0x000003
            if((i < *nal_size - 1) && (nal_buf[i+1] > 0x03))
            {
                return -1;
            }

            // if cabac_zero_word is used, the final byte of this NAL unit(0x03) is discarded, and the last two bytes of RBSP must be 0x0000
            if(i == *nal_size - 1)
            {
                break;
            }

            i++;
            count = 0;
        }

        if ( j >= *rbsp_size ) 
        {
            // error, not enough space
            return -1;
        }

        rbsp_buf[j] = nal_buf[i];
        if(nal_buf[i] == 0x00)
        {
            count++;
        }
        else
        {
            count = 0;
        }
        j++;
    }

    *nal_size = i;
    *rbsp_size = j;
    return j;
}